

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidiin.cpp
# Opt level: O0

int anon_unknown.dwarf_fc70::RtMidiIn_ctor(lua_State *L)

{
  RtMidi *this;
  mapped_type *pmVar1;
  RtMidiError *midierror;
  RtMidiError *err;
  allocator<char> local_41;
  string local_40;
  RtMidi *local_20;
  RtMidiIn *midiin;
  lua_State *L_local;
  
  midiin = (RtMidiIn *)L;
  this = (RtMidi *)lua_newuserdata(L,0x10);
  local_20 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"RtMidi Input Client",&local_41);
  RtMidiIn::RtMidiIn((RtMidiIn *)this,UNSPECIFIED,&local_40,100);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  RtMidi_init(local_20,(lua_State *)midiin,-1);
  std::pair<RtMidiIn_*,_lua_State_*>::pair<RtMidiIn_*&,_lua_State_*&,_true>
            ((pair<RtMidiIn_*,_lua_State_*> *)&err,(RtMidiIn **)&local_20,(lua_State **)&midiin);
  pmVar1 = std::
           map<std::pair<RtMidiIn_*,_lua_State_*>,_int,_std::less<std::pair<RtMidiIn_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>_>
           ::operator[]((map<std::pair<RtMidiIn_*,_lua_State_*>,_int,_std::less<std::pair<RtMidiIn_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>_>
                         *)(anonymous_namespace)::RtMidiIn_callbacks,(key_type *)&err);
  *pmVar1 = -2;
  lua_getfield(midiin,0xfff0b9d8,"luartmidi.rtmidiin");
  lua_setmetatable(midiin,0xfffffffe);
  return 1;
}

Assistant:

int RtMidiIn_ctor(lua_State *L) {
	auto midiin = reinterpret_cast<RtMidiIn *>(
	 lua_newuserdata(L, sizeof(RtMidiIn)));
	try {
		new (midiin) RtMidiIn { };
		RtMidi_init(*midiin, L, -1);
		RtMidiIn_callbacks[{midiin, L}] = LUA_NOREF;
		luaL_getmetatable(L, MT_RTMIDIIN);
		lua_setmetatable(L, -2);
		return 1;
	}
	catch (RtMidiError &err) {
		auto midierror = reinterpret_cast<RtMidiError *>(
		 lua_newuserdata(L, sizeof(RtMidiError)));
		new (midierror) RtMidiError {err};
		luaL_getmetatable(L, MT_RTMIDIERROR);
		lua_setmetatable(L, -2);
		return lua_error(L);
	}
}